

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O2

void grasshopper_encrypt_block
               (grasshopper_round_keys_t *subkeys,grasshopper_w128_t *source,
               grasshopper_w128_t *target,grasshopper_w128_t *buffer)

{
  long lVar1;
  
  grasshopper_copy128(target,source);
  for (lVar1 = 0; lVar1 != 0x90; lVar1 = lVar1 + 0x10) {
    grasshopper_append128(target,(grasshopper_w128_t *)((long)subkeys->k + lVar1));
    grasshopper_append128multi(buffer,target,grasshopper_pil_enc128);
  }
  grasshopper_append128(target,subkeys->k + 9);
  return;
}

Assistant:

void grasshopper_encrypt_block(grasshopper_round_keys_t* subkeys, grasshopper_w128_t* source,
                               grasshopper_w128_t* target, grasshopper_w128_t* buffer) {
    int i;
    grasshopper_copy128(target, source);

    for (i = 0; i < 9; i++) {
        grasshopper_append128(target, &subkeys->k[i]);
        grasshopper_append128multi(buffer, target, grasshopper_pil_enc128);
    }

    grasshopper_append128(target, &subkeys->k[9]);
}